

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall
StringWriter_ReadMaxTwoByteLengthCharString_Test::TestBody
          (StringWriter_ReadMaxTwoByteLengthCharString_Test *this)

{
  bool bVar1;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> out;
  const_iterator first;
  char *pcVar2;
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *archive_00;
  AssertHelper local_108;
  Message local_100;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  allocator local_a1;
  undefined1 local_a0 [8];
  string expected;
  string actual;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  archive;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> output_it;
  char src_char;
  size_type src_length;
  StringWriter_ReadMaxTwoByteLengthCharString_Test *this_local;
  
  out = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&(this->super_StringWriter).bytes_);
  pstore::varint::
  encode<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (0x3fff,out);
  archive.first_._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )std::
         generate_n<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_long,StringWriter_ReadMaxTwoByteLengthCharString_Test::TestBody()::__0>
                   (out,0x3fff,(anon_class_1_1_cef2c24f)0x61);
  first = std::begin<pstore::serialize::archive::vector_writer>(&(this->super_StringWriter).writer_)
  ;
  local_58._M_current =
       (uchar *)pstore::serialize::archive::
                make_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (first._M_current);
  pstore::serialize::
  read<std::__cxx11::string,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expected.field_2 + 8),(serialize *)&local_58,archive_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a0,0x3fff,'a',&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_c8,"expected","actual",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expected.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_f0._M_current =
       (uchar *)std::end<pstore::serialize::archive::vector_writer>
                          (&(this->super_StringWriter).writer_);
  local_f8 = pstore::serialize::archive::
             range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::iterator((range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_58);
  testing::internal::EqHelper::
  Compare<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nullptr>
            ((EqHelper *)local_e8,"std::end (writer_)","archive.iterator ()",&local_f0,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(expected.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST_F (StringWriter, ReadMaxTwoByteLengthCharString) {
    auto const src_length = three_byte_varint - 1;
    auto const src_char = 'a';

    // Produce a serialized string of 'length' character 'a's.
    {
        auto output_it = std::back_inserter (bytes_);
        pstore::varint::encode (src_length, output_it);
        std::generate_n (output_it, src_length,
                         [src_char] () { return static_cast<std::uint8_t> (src_char); });
    }

    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    std::string const actual = pstore::serialize::read<std::string> (archive);
    std::string const expected (src_length, src_char);
    EXPECT_EQ (expected, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}